

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void picked_container(obj *obj)

{
  obj *obj_00;
  
  for (obj_00 = obj->cobj; obj_00 != (obj *)0x0; obj_00 = obj_00->nobj) {
    if (obj_00->oclass != '\f') {
      if ((*(uint *)&obj_00->field_0x4a & 8) != 0) {
        *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xfffffff7;
      }
      if (obj_00->cobj != (obj *)0x0) {
        picked_container(obj_00);
      }
    }
  }
  return;
}

Assistant:

void picked_container(struct obj *obj)
{
	struct obj *otmp;

	/* the "top" container is treated in the calling fn */
	for (otmp = obj->cobj; otmp; otmp = otmp->nobj) {
	    if (otmp->oclass == COIN_CLASS) continue;

	    if (otmp->no_charge)
		otmp->no_charge = 0;

	    if (Has_contents(otmp))
		picked_container(otmp);
	}
}